

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

void __thiscall
cmCTestCVS::LogParser::LogParser
          (LogParser *this,cmCTestCVS *cvs,char *prefix,
          vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revs)

{
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revs_local;
  char *prefix_local;
  cmCTestCVS *cvs_local;
  LogParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_011cd720;
  this->CVS = cvs;
  this->Revisions = revs;
  cmsys::RegularExpression::RegularExpression(&this->RegexRevision);
  cmsys::RegularExpression::RegularExpression(&this->RegexBranches);
  cmsys::RegularExpression::RegularExpression(&this->RegexPerson);
  this->Section = SectionHeader;
  cmCTestVC::Revision::Revision(&this->Rev);
  cmProcessTools::LineParser::SetLog(&this->super_LineParser,(cvs->super_cmCTestVC).Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexRevision,"^revision +([^ ]*) *$");
  cmsys::RegularExpression::compile(&this->RegexBranches,"^branches: .*$");
  cmsys::RegularExpression::compile(&this->RegexPerson,"^date: +([^;]+); +author: +([^;]+);");
  return;
}

Assistant:

LogParser(cmCTestCVS* cvs, const char* prefix, std::vector<Revision>& revs)
    : CVS(cvs)
    , Revisions(revs)
  {
    this->SetLog(&cvs->Log, prefix);
    this->RegexRevision.compile("^revision +([^ ]*) *$");
    this->RegexBranches.compile("^branches: .*$");
    this->RegexPerson.compile("^date: +([^;]+); +author: +([^;]+);");
  }